

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.cpp
# Opt level: O0

bool __thiscall
wallet::WalletBatch::WriteDescriptorKey
          (WalletBatch *this,uint256 *desc_id,CPubKey *pubkey,CPrivKey *privkey)

{
  byte bVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  iterator in1;
  const_iterator __position;
  const_iterator __first;
  iterator this_01;
  pair<std::vector<unsigned_char,_secure_allocator<unsigned_char>_>,_uint256> *in_RCX;
  long in_FS_OFFSET;
  vector<unsigned_char,_std::allocator<unsigned_char>_> key;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<uint256,_CPubKey>_>
  *in_stack_fffffffffffffdc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdd0;
  undefined7 in_stack_fffffffffffffdd8;
  undefined1 in_stack_fffffffffffffddf;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<uint256,_CPubKey>_>
  *key_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffdf0;
  uchar *in_stack_fffffffffffffdf8;
  size_type in_stack_fffffffffffffe00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffe08;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_secure_allocator<unsigned_char>_>_>
  in_stack_fffffffffffffe28;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<uint256,_CPubKey>_>
  local_168 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffdc8);
  CPubKey::size((CPubKey *)in_stack_fffffffffffffdc8);
  std::vector<unsigned_char,_secure_allocator<unsigned_char>_>::size
            ((vector<unsigned_char,_secure_allocator<unsigned_char>_> *)in_stack_fffffffffffffdc8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
            (in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffdd0);
  __gnu_cxx::
  __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>::
  __normal_iterator<unsigned_char*>
            ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              *)CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8),
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              *)in_stack_fffffffffffffdd0);
  CPubKey::begin((CPubKey *)in_stack_fffffffffffffdc8);
  this_00 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
            CPubKey::end((CPubKey *)CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8));
  in1 = std::vector<unsigned_char,std::allocator<unsigned_char>>::insert<unsigned_char_const*,void>
                  (this_00,in_stack_fffffffffffffe28._M_current,in_stack_fffffffffffffdf8,
                   (uchar *)in_stack_fffffffffffffdf0);
  key_00 = local_168;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffdd0);
  __gnu_cxx::
  __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>::
  __normal_iterator<unsigned_char*>
            ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              *)CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8),
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              *)in_stack_fffffffffffffdd0);
  __position = std::vector<unsigned_char,_secure_allocator<unsigned_char>_>::begin
                         ((vector<unsigned_char,_secure_allocator<unsigned_char>_> *)
                          in_stack_fffffffffffffdd0);
  __first = std::vector<unsigned_char,_secure_allocator<unsigned_char>_>::end
                      ((vector<unsigned_char,_secure_allocator<unsigned_char>_> *)
                       in_stack_fffffffffffffdd0);
  this_01 = std::vector<unsigned_char,std::allocator<unsigned_char>>::
            insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,secure_allocator<unsigned_char>>>,void>
                      (in_stack_fffffffffffffdf0,__position._M_current,__first._M_current,
                       in_stack_fffffffffffffe28);
  std::make_pair<uint256_const&,CPubKey_const&>
            ((uint256 *)CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8),
             (CPubKey *)in_stack_fffffffffffffdd0);
  std::make_pair<std::__cxx11::string_const&,std::pair<uint256,CPubKey>>
            (in_stack_fffffffffffffdd0,(pair<uint256,_CPubKey> *)in_stack_fffffffffffffdc8);
  Hash<std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in1._M_current);
  std::make_pair<std::vector<unsigned_char,secure_allocator<unsigned_char>>const&,uint256>
            ((vector<unsigned_char,_secure_allocator<unsigned_char>_> *)in_stack_fffffffffffffdd0,
             (uint256 *)in_stack_fffffffffffffdc8);
  bVar1 = WriteIC<std::pair<std::__cxx11::string,std::pair<uint256,CPubKey>>,std::pair<std::vector<unsigned_char,secure_allocator<unsigned_char>>,uint256>>
                    ((WalletBatch *)this_01._M_current,key_00,in_RCX,(bool)in_stack_fffffffffffffddf
                    );
  std::pair<std::vector<unsigned_char,_secure_allocator<unsigned_char>_>,_uint256>::~pair
            ((pair<std::vector<unsigned_char,_secure_allocator<unsigned_char>_>,_uint256> *)
             in_stack_fffffffffffffdc8);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<uint256,_CPubKey>_>
  ::~pair(in_stack_fffffffffffffdc8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(bVar1,in_stack_fffffffffffffdd8));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (bool)(bVar1 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool WalletBatch::WriteDescriptorKey(const uint256& desc_id, const CPubKey& pubkey, const CPrivKey& privkey)
{
    // hash pubkey/privkey to accelerate wallet load
    std::vector<unsigned char> key;
    key.reserve(pubkey.size() + privkey.size());
    key.insert(key.end(), pubkey.begin(), pubkey.end());
    key.insert(key.end(), privkey.begin(), privkey.end());

    return WriteIC(std::make_pair(DBKeys::WALLETDESCRIPTORKEY, std::make_pair(desc_id, pubkey)), std::make_pair(privkey, Hash(key)), false);
}